

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__bitcount(uint a)

{
  uint uVar1;
  uint a_local;
  
  uVar1 = (a & 0x55555555) + (a >> 1 & 0x55555555);
  uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
  uVar1 = uVar1 + (uVar1 >> 4) & 0xf0f0f0f;
  uVar1 = uVar1 + (uVar1 >> 8);
  return uVar1 + (uVar1 >> 0x10) & 0xff;
}

Assistant:

static int stbi__bitcount(unsigned int a) {
  a = (a & 0x55555555) + ((a >> 1) & 0x55555555); // max 2
  a = (a & 0x33333333) + ((a >> 2) & 0x33333333); // max 4
  a = (a + (a >> 4)) & 0x0f0f0f0f;                // max 8 per 4, now 8 bits
  a = (a + (a >> 8));                             // max 16 per 8 bits
  a = (a + (a >> 16));                            // max 32 per 8 bits
  return a & 0xff;
}